

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  XmlWriter *in_RSI;
  undefined8 *in_RDI;
  ostream *in_stack_ffffffffffffffe8;
  
  CumulativeReporterBase::CumulativeReporterBase(&this->super_CumulativeReporterBase,_config);
  *in_RDI = &PTR__JunitReporter_00233718;
  ReporterConfig::stream((ReporterConfig *)in_RSI);
  XmlWriter::XmlWriter(in_RSI,in_stack_ffffffffffffffe8);
  Timer::Timer((Timer *)(in_RDI + 0x22));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0x23));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0x52));
  *(undefined1 *)(in_RDI + 0x18) = 1;
  return;
}

Assistant:

JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
        }